

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  HttpSocket *this;
  allocator<char> local_69;
  SocketSet ss;
  POST post;
  
  signal(0xd,(__sighandler_t)0x1);
  minihttp::InitNetwork();
  atexit(minihttp::StopNetwork);
  this = (HttpSocket *)operator_new(0x238);
  HttpDumpSocket::HttpDumpSocket((HttpDumpSocket *)this);
  this->_keep_alive = 3;
  minihttp::TcpSocket::SetBufsizeIn((TcpSocket *)this,0x10000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"minihttp",(allocator<char> *)&post);
  std::__cxx11::string::_M_assign((string *)&this->_user_agent);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"example.com",(allocator<char> *)&post);
  minihttp::HttpSocket::Download(this,(string *)&ss,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"http://www.ietf.org/rfc/rfc2616.txt",(allocator<char> *)&post);
  minihttp::HttpSocket::Download(this,(string *)&ss,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"https://example.com",(allocator<char> *)&post);
  minihttp::HttpSocket::Download(this,(string *)&ss,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"raw.githubusercontent.com/fgenesis/minihttp/master/minihttp.h",
             (allocator<char> *)&post);
  minihttp::HttpSocket::Download(this,(string *)&ss,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&ss);
  post.data._M_dataplus._M_p = (pointer)&post.data.field_2;
  post.data._M_string_length = 0;
  post.data.field_2._M_local_buf[0] = '\0';
  minihttp::POST::add(&post,"a","b");
  minihttp::POST::add(&post,"x","y");
  minihttp::POST::add(&post,"long string","possibly invalid data: /x/&$+*#\'?!;");
  minihttp::POST::add(&post,"normal","data");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"https://httpbin.org/post",&local_69);
  minihttp::HttpSocket::Download(this,(string *)&ss,(char *)0x0,(void *)0x0,&post);
  std::__cxx11::string::~string((string *)&ss);
  ss._vptr_SocketSet = (_func_int **)&PTR__SocketSet_0010ed00;
  ss._store._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ss._store._M_t._M_impl.super__Rb_tree_header._M_header;
  ss._store._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ss._store._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ss._store._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ss._store._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ss._store._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  minihttp::SocketSet::add(&ss,(TcpSocket *)this,true);
  while (ss._store._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    minihttp::SocketSet::update(&ss);
  }
  minihttp::SocketSet::~SocketSet(&ss);
  std::__cxx11::string::~string((string *)&post);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef SIGPIPE
    // On *NIX systems, don't signal writing to a closed socket.
    signal(SIGPIPE, SIG_IGN);
#endif

    // minihttp::Download() in example 1 does this automatically,
    // but if this function is not used this has to be called first to init networking properly.
    minihttp::InitNetwork();
    atexit(minihttp::StopNetwork);

    HttpDumpSocket *ht = new HttpDumpSocket;
    ht->SetKeepAlive(3);
    ht->SetBufsizeIn(64 * 1024);
    ht->SetUserAgent("minihttp"); // Let the server know who we are. This is optional but it seems that some servers check that this is set.

    // HTTP GET
    ht->Download("example.com");
    ht->Download("http://www.ietf.org/rfc/rfc2616.txt");
    // Downloads requested in succession will be queued and processed one after another

    // HTTP GET with SSL, if SSL support is enabled:
    ht->Download("https://example.com"); // SSL connection
    ht->Download("raw.githubusercontent.com/fgenesis/minihttp/master/minihttp.h"); // transparent HTTP -> HTTPS redirection

    // Example HTTP POST request:
    minihttp::POST post;
    post.add("a", "b");
    post.add("x", "y");
    post.add("long string", "possibly invalid data: /x/&$+*#'?!;");
    post.add("normal", "data");
    ht->Download("https://httpbin.org/post", NULL, NULL, &post);

    minihttp::SocketSet ss;

    ss.add(ht, true); // true: Delete socket if closed and no task left.

    // This is non-blocking and could be done in background or by another thread.
    // Hogs quite some CPU doing it this way, though.
    while(ss.size())
        ss.update();

    return 0;
}